

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void MirrorUVPlane(uint8_t *src_uv,int src_stride_uv,uint8_t *dst_uv,int dst_stride_uv,int width,
                  int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *MirrorUVRow;
  int y;
  code *pcVar2;
  int local_28;
  int local_24;
  long local_18;
  int local_c;
  long local_8;
  
  pcVar2 = MirrorUVRow_C;
  local_24 = in_R9D;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_R9D < 0) {
    local_24 = -in_R9D;
    local_8 = in_RDI + (local_24 + -1) * in_ESI;
    local_c = -in_ESI;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = MirrorUVRow_Any_SSSE3, (in_R8D & 7) == 0)) {
    pcVar2 = MirrorUVRow_SSSE3;
  }
  iVar1 = libyuv::TestCpuFlag(0);
  if ((iVar1 != 0) && (pcVar2 = MirrorUVRow_Any_AVX2, (in_R8D & 0xf) == 0)) {
    pcVar2 = MirrorUVRow_AVX2;
  }
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    (*pcVar2)(local_8,local_18,in_R8D);
    local_8 = local_8 + local_c;
    local_18 = local_18 + in_ECX;
  }
  return;
}

Assistant:

LIBYUV_API
void MirrorUVPlane(const uint8_t* src_uv,
                   int src_stride_uv,
                   uint8_t* dst_uv,
                   int dst_stride_uv,
                   int width,
                   int height) {
  int y;
  void (*MirrorUVRow)(const uint8_t* src, uint8_t* dst, int width) =
      MirrorUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_uv = src_uv + (height - 1) * src_stride_uv;
    src_stride_uv = -src_stride_uv;
  }
#if defined(HAS_MIRRORUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MirrorUVRow = MirrorUVRow_Any_NEON;
    if (IS_ALIGNED(width, 32)) {
      MirrorUVRow = MirrorUVRow_NEON;
    }
  }
#endif
#if defined(HAS_MIRRORUVROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    MirrorUVRow = MirrorUVRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      MirrorUVRow = MirrorUVRow_SSSE3;
    }
  }
#endif
#if defined(HAS_MIRRORUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    MirrorUVRow = MirrorUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      MirrorUVRow = MirrorUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_MIRRORUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    MirrorUVRow = MirrorUVRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      MirrorUVRow = MirrorUVRow_MSA;
    }
  }
#endif

  // MirrorUV plane
  for (y = 0; y < height; ++y) {
    MirrorUVRow(src_uv, dst_uv, width);
    src_uv += src_stride_uv;
    dst_uv += dst_stride_uv;
  }
}